

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-parser.c
# Opt level: O3

bc_trie_t * blogc_source_parse(char *src,size_t src_len,int toctree_maxdepth,bc_error_t **err)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  bc_trie_t *trie;
  bc_error_t *pbVar5;
  char *pcVar6;
  void *pvVar7;
  undefined4 in_register_00000014;
  size_t sVar8;
  int iVar9;
  size_t sVar10;
  char *pcVar11;
  bc_slist_t **headers_00;
  bc_slist_t *headers;
  char *endl;
  char *description;
  char *first_header;
  size_t end_excerpt;
  char *endptr;
  char *local_90;
  size_t local_88;
  bc_slist_t *local_80;
  char *local_78;
  long local_70;
  char *local_68;
  char *local_60;
  size_t local_58;
  char *local_50;
  size_t local_48;
  size_t local_40;
  char *local_38;
  
  local_70 = CONCAT44(in_register_00000014,toctree_maxdepth);
  if ((err != (bc_error_t **)0x0) && (*err == (bc_error_t *)0x0)) {
    local_40 = 0;
    trie = bc_trie_new(free);
    local_48 = src_len - 1;
    iVar9 = 1;
    local_90 = (char *)0x0;
    local_88 = 0;
    sVar10 = 0;
    do {
      if (src_len == sVar10) {
        if (*err == (bc_error_t *)0x0) {
          sVar10 = bc_trie_size(trie);
          if (sVar10 != 0) {
switchD_00104b80_default:
            pbVar5 = *err;
            goto LAB_00104bd6;
          }
          switch(iVar9) {
          case 1:
            pcVar11 = "Your source file is empty.";
            break;
          case 2:
            pcVar11 = "Your last configuration key is missing \':\' and the value";
            break;
          case 3:
            pcVar11 = "Configuration value not provided for \'%s\'.";
            goto LAB_00104b9b;
          case 4:
            pcVar11 = "No line ending after the configuration value for \'%s\'.";
LAB_00104b9b:
            pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,src_len,pcVar11,local_90)
            ;
            goto LAB_00104bd3;
          default:
            goto switchD_00104b80_default;
          }
          pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,src_len,pcVar11);
LAB_00104bd3:
          *err = pbVar5;
LAB_00104bd6:
          if (pbVar5 == (bc_error_t *)0x0) {
            return trie;
          }
        }
        break;
      }
      sVar2 = local_88;
      if (6 < iVar9 - 1U) goto LAB_00104a32;
      bVar1 = src[sVar10];
      switch(iVar9) {
      case 1:
        if ((((bVar1 < 0x21) && (iVar9 = 1, (0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))
            || (iVar9 = 2, sVar2 = sVar10, (byte)(bVar1 + 0xbf) < 0x1a)) ||
           (iVar9 = 5, sVar2 = local_88, bVar1 == 0x2d)) break;
        pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,sVar10,
                                 "Can\'t find a configuration key or the content separator.");
        *err = pbVar5;
        iVar9 = 1;
        goto LAB_00104a35;
      case 2:
        iVar9 = 2;
        if (((byte)(bVar1 + 0xbf) < 0x1a) || (bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10)) break;
        if (bVar1 == 0x3a) {
          pcVar11 = src + local_88;
          local_90 = bc_strndup(pcVar11,sVar10 - local_88);
          iVar9 = 3;
          switch(sVar10 - local_88) {
          case 7:
            sVar8 = 7;
            pcVar6 = "CONTENT";
            break;
          case 8:
            sVar8 = 8;
            pcVar6 = "FILENAME";
            break;
          case 9:
            iVar4 = strncmp("PAGE_NEXT",pcVar11,9);
            if (iVar4 == 0) goto LAB_00104b23;
            sVar8 = 9;
            pcVar6 = "PAGE_LAST";
LAB_00104aa6:
            iVar4 = strncmp(pcVar6,pcVar11,sVar8);
            goto joined_r0x00104ab2;
          case 10:
            sVar8 = 10;
            pcVar6 = "PAGE_FIRST";
            break;
          default:
switchD_00104766_caseD_b:
            goto LAB_00104a32;
          case 0xc:
            sVar8 = 0xc;
            pcVar6 = "PAGE_CURRENT";
            break;
          case 0xd:
            iVar4 = strncmp("PAGE_PREVIOUS",pcVar11,0xd);
            if (iVar4 != 0) {
              sVar8 = 0xd;
              pcVar6 = "BLOGC_VERSION";
              goto LAB_00104aa6;
            }
            goto LAB_00104b23;
          case 0xe:
            sVar8 = 0xe;
            pcVar6 = "DATE_FORMATTED";
            break;
          case 0x13:
            sVar8 = 0x13;
            pcVar6 = "DATE_LAST_FORMATTED";
            break;
          case 0x14:
            sVar8 = 0x14;
            pcVar6 = "DATE_FIRST_FORMATTED";
          }
          iVar4 = strncmp(pcVar6,pcVar11,sVar8);
joined_r0x00104ab2:
          if (iVar4 != 0) break;
LAB_00104b23:
          pbVar5 = bc_error_new_printf(BLOGC_ERROR_SOURCE_PARSER,
                                       "\'%s\' variable is forbidden in source files. It will be set for you by the compiler."
                                       ,local_90);
        }
        else {
          pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,sVar10,
                                   "Invalid configuration key.");
        }
        *err = pbVar5;
        iVar9 = 2;
        goto LAB_00104a35;
      case 3:
        if ((bVar1 == 10) || (bVar1 == 0xd)) {
          pcVar11 = bc_strdup("");
          bc_trie_insert(trie,local_90,pcVar11);
LAB_001046d1:
          free(local_90);
          iVar9 = 1;
          local_90 = (char *)0x0;
        }
        else {
          iVar9 = 4;
          sVar2 = sVar10;
        }
        break;
      case 4:
        if ((bVar1 == 0xd) || (iVar9 = 4, bVar1 == 10)) {
          pcVar11 = bc_strndup(src + local_88,sVar10 - local_88);
          pcVar6 = bc_str_strip(pcVar11);
          pcVar6 = bc_strdup(pcVar6);
          bc_trie_insert(trie,local_90,pcVar6);
          free(pcVar11);
          goto LAB_001046d1;
        }
        break;
      case 5:
        if ((bVar1 == 10) || (bVar1 == 0xd)) {
          iVar9 = 6;
        }
        else {
          iVar9 = 5;
          if (bVar1 != 0x2d) {
            pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,sVar10,
                                     "Invalid content separator. Must be more than one \'-\' characters."
                                    );
            *err = pbVar5;
            iVar9 = 5;
            goto LAB_00104a35;
          }
        }
        break;
      case 6:
        iVar9 = 6;
        if ((bVar1 != 10) && (bVar1 != 0xd)) {
          iVar9 = 7;
          sVar2 = sVar10;
        }
        break;
      case 7:
        iVar9 = 7;
        if (local_48 == sVar10) {
          pcVar11 = bc_strndup(src + local_88,src_len - local_88);
          bc_trie_insert(trie,"RAW_CONTENT",pcVar11);
          local_60 = (char *)0x0;
          local_68 = (char *)0x0;
          local_78 = (char *)0x0;
          local_80 = (bc_slist_t *)0x0;
          pvVar7 = bc_trie_lookup(trie,"TOCTREE");
          headers_00 = (bc_slist_t **)0x0;
          if (pvVar7 == (void *)0x0) {
            headers_00 = &local_80;
          }
          local_50 = blogc_content_parse(pcVar11,&local_40,&local_60,&local_68,&local_78,headers_00)
          ;
          if (local_60 != (char *)0x0) {
            pvVar7 = bc_trie_lookup(trie,"FIRST_HEADER");
            if (pvVar7 == (void *)0x0) {
              bc_trie_insert(trie,"FIRST_HEADER",local_60);
            }
            else {
              free(local_60);
            }
          }
          if (local_68 != (char *)0x0) {
            pvVar7 = bc_trie_lookup(trie,"DESCRIPTION");
            if (pvVar7 == (void *)0x0) {
              bc_trie_insert(trie,"DESCRIPTION",local_68);
            }
            else {
              free(local_68);
            }
          }
          sVar3 = src_len;
          if (local_80 != (bc_slist_t *)0x0) {
            pcVar11 = (char *)bc_trie_lookup(trie,"TOCTREE_MAXDEPTH");
            if (((pcVar11 != (char *)0x0) &&
                (local_70 = strtol(pcVar11,&local_38,10), *pcVar11 != '\0')) && (*local_38 != '\0'))
            {
              pbVar5 = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER,src,src_len,local_48,
                                       "Invalid value for \'TOCTREE_MAXDEPTH\' variable: %s.",
                                       pcVar11);
              *err = pbVar5;
              blogc_toctree_free(local_80);
              free(local_78);
              free(local_50);
              goto switchD_00104766_caseD_b;
            }
            pcVar11 = blogc_toctree_render(local_80,(int)local_70,local_78);
            blogc_toctree_free(local_80);
            sVar3 = src_len;
            if (pcVar11 != (char *)0x0) {
              local_58 = src_len;
              bc_trie_insert(trie,"TOCTREE",pcVar11);
              sVar3 = local_58;
            }
          }
          local_58 = sVar3;
          free(local_78);
          pcVar11 = local_50;
          bc_trie_insert(trie,"CONTENT",local_50);
          if (local_40 == 0) {
            pcVar11 = bc_strdup(pcVar11);
          }
          else {
            pcVar11 = bc_strndup(pcVar11,local_40);
          }
          bc_trie_insert(trie,"EXCERPT",pcVar11);
          src_len = local_58;
        }
      }
LAB_00104a32:
      local_88 = sVar2;
      pbVar5 = *err;
LAB_00104a35:
      sVar10 = sVar10 + 1;
    } while (pbVar5 == (bc_error_t *)0x0);
    free(local_90);
    bc_trie_free(trie);
  }
  return (bc_trie_t *)0x0;
}

Assistant:

bc_trie_t*
blogc_source_parse(const char *src, size_t src_len, int toctree_maxdepth,
    bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    size_t current = 0;
    size_t start = 0;
    size_t end_excerpt = 0;

    char *key = NULL;
    char *tmp = NULL;
    char *content = NULL;
    bc_trie_t *rv = bc_trie_new(free);

    blogc_source_parser_state_t state = SOURCE_START;

    while (current < src_len) {
        char c = src[current];

        switch (state) {

            case SOURCE_START:
                if (c == ' ' || c == '\t' || c == '\n' || c == '\r')
                    break;
                if (c >= 'A' && c <= 'Z') {
                    state = SOURCE_CONFIG_KEY;
                    start = current;
                    break;
                }
                if (c == '-') {
                    state = SOURCE_SEPARATOR;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current,
                    "Can't find a configuration key or the content separator.");
                break;

            case SOURCE_CONFIG_KEY:
                if ((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')
                    break;
                if (c == ':') {
                    key = bc_strndup(src + start, current - start);
                    if (((current - start == 8) &&
                         (0 == strncmp("FILENAME", src + start, 8))) ||
                        ((current - start == 7) &&
                         (0 == strncmp("CONTENT", src + start, 7))) ||
                        ((current - start == 14) &&
                         (0 == strncmp("DATE_FORMATTED", src + start, 14))) ||
                        ((current - start == 20) &&
                         (0 == strncmp("DATE_FIRST_FORMATTED", src + start, 20))) ||
                        ((current - start == 19) &&
                         (0 == strncmp("DATE_LAST_FORMATTED", src + start, 19))) ||
                        ((current - start == 10) &&
                         (0 == strncmp("PAGE_FIRST", src + start, 10))) ||
                        ((current - start == 13) &&
                         (0 == strncmp("PAGE_PREVIOUS", src + start, 13))) ||
                        ((current - start == 12) &&
                         (0 == strncmp("PAGE_CURRENT", src + start, 12))) ||
                        ((current - start == 9) &&
                         (0 == strncmp("PAGE_NEXT", src + start, 9))) ||
                        ((current - start == 9) &&
                         (0 == strncmp("PAGE_LAST", src + start, 9))) ||
                        ((current - start == 13) &&
                         (0 == strncmp("BLOGC_VERSION", src + start, 13))))
                    {
                        *err = bc_error_new_printf(BLOGC_ERROR_SOURCE_PARSER,
                            "'%s' variable is forbidden in source files. It will "
                            "be set for you by the compiler.", key);
                        break;
                    }
                    state = SOURCE_CONFIG_VALUE_START;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Invalid configuration key.");
                break;

            case SOURCE_CONFIG_VALUE_START:
                if (c != '\n' && c != '\r') {
                    state = SOURCE_CONFIG_VALUE;
                    start = current;
                    break;
                }
                bc_trie_insert(rv, key, bc_strdup(""));
                free(key);
                key = NULL;
                state = SOURCE_START;
                break;

            case SOURCE_CONFIG_VALUE:
                if (c == '\n' || c == '\r') {
                    tmp = bc_strndup(src + start, current - start);
                    bc_trie_insert(rv, key, bc_strdup(bc_str_strip(tmp)));
                    free(tmp);
                    free(key);
                    key = NULL;
                    state = SOURCE_START;
                }
                break;

            case SOURCE_SEPARATOR:
                if (c == '-')
                    break;
                if (c == '\n' || c == '\r') {
                    state = SOURCE_CONTENT_START;
                    break;
                }
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current,
                    "Invalid content separator. Must be more than one '-' characters.");
                break;

            case SOURCE_CONTENT_START:
                if (c == '\n' || c == '\r')
                    break;
                start = current;
                state = SOURCE_CONTENT;
                break;

            case SOURCE_CONTENT:
                if (current == (src_len - 1)) {
                    tmp = bc_strndup(src + start, src_len - start);
                    bc_trie_insert(rv, "RAW_CONTENT", tmp);
                    char *first_header = NULL;
                    char *description = NULL;
                    char *endl = NULL;
                    bc_slist_t *headers = NULL;
                    bool read_headers = (NULL == bc_trie_lookup(rv, "TOCTREE"));
                    content = blogc_content_parse(tmp, &end_excerpt,
                        &first_header, &description, &endl, read_headers ? &headers : NULL);
                    if (first_header != NULL) {
                        // do not override source-provided first_header.
                        if (NULL == bc_trie_lookup(rv, "FIRST_HEADER")) {
                            // no need to free, because we are transfering memory
                            // ownership to the trie.
                            bc_trie_insert(rv, "FIRST_HEADER", first_header);
                        }
                        else {
                            free(first_header);
                        }
                    }
                    if (description != NULL) {
                        // do not override source-provided description.
                        if (NULL == bc_trie_lookup(rv, "DESCRIPTION")) {
                            // no need to free, because we are transfering memory
                            // ownership to the trie.
                            bc_trie_insert(rv, "DESCRIPTION", description);
                        }
                        else {
                            free(description);
                        }
                    }
                    if (headers != NULL) {
                        // we already validated that the user do not defined TOCTREE
                        // manually in source file.
                        const char *maxdepth = bc_trie_lookup(rv, "TOCTREE_MAXDEPTH");
                        if (maxdepth != NULL) {
                            char *endptr;
                            toctree_maxdepth = strtol(maxdepth, &endptr, 10);
                            if (*maxdepth != '\0' && *endptr != '\0') {
                                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                                    current,
                                    "Invalid value for 'TOCTREE_MAXDEPTH' variable: %s.",
                                    maxdepth);
                                blogc_toctree_free(headers);
                                free(endl);
                                free(content);
                                break;
                            }
                        }
                        char *toctree = blogc_toctree_render(headers, toctree_maxdepth, endl);
                        blogc_toctree_free(headers);
                        if (toctree != NULL) {
                            bc_trie_insert(rv, "TOCTREE", toctree);
                        }
                    }
                    free(endl);
                    bc_trie_insert(rv, "CONTENT", content);
                    bc_trie_insert(rv, "EXCERPT", end_excerpt == 0 ?
                        bc_strdup(content) : bc_strndup(content, end_excerpt));
                }
                break;
        }

        if (*err != NULL)
            break;

        current++;
    }

    if (*err == NULL && bc_trie_size(rv) == 0) {

        // ok, nothing found in the config trie, but no error set either.
        // let's try to be nice with the users and provide some reasonable
        // output. :)
        switch (state) {
            case SOURCE_START:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Your source file is empty.");
                break;
            case SOURCE_CONFIG_KEY:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Your last configuration key is missing ':' and "
                    "the value");
                break;
            case SOURCE_CONFIG_VALUE_START:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "Configuration value not provided for '%s'.",
                    key);
                break;
            case SOURCE_CONFIG_VALUE:
                *err = bc_error_parser(BLOGC_ERROR_SOURCE_PARSER, src, src_len,
                    current, "No line ending after the configuration value for "
                    "'%s'.", key);
                break;
            case SOURCE_SEPARATOR:
            case SOURCE_CONTENT_START:
            case SOURCE_CONTENT:
                break;  // won't happen, and if even happen, shouldn't be fatal
        }
    }

    if (*err != NULL) {
        free(key);
        bc_trie_free(rv);
        return NULL;
    }

    return rv;
}